

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::UniformLocImplicitInSomeStages3::Run(UniformLocImplicitInSomeStages3 *this)

{
  long lVar1;
  DefOccurence local_1010;
  DefOccurence local_100c;
  LayoutSpecifierBase local_1008;
  DefOccurence local_ff4;
  LayoutSpecifierBase local_ff0;
  UniformType local_fe0;
  Uniform local_f50;
  LayoutSpecifierBase local_d78;
  DefOccurence local_d68;
  DefOccurence local_d64;
  LayoutSpecifierBase local_d60;
  DefOccurence local_d4c;
  LayoutSpecifierBase local_d48;
  UniformType local_d38;
  Uniform local_ca8;
  LayoutSpecifierBase local_ad0;
  DefOccurence local_ac0;
  DefOccurence local_abc;
  LayoutSpecifierBase local_ab8;
  DefOccurence local_aa4;
  LayoutSpecifierBase local_aa0;
  UniformType local_a90;
  Uniform local_a00;
  LayoutSpecifierBase local_828;
  DefOccurence local_818;
  DefOccurence local_814;
  LayoutSpecifierBase local_810;
  DefOccurence local_7fc;
  LayoutSpecifierBase local_7f8;
  UniformType local_7e8;
  Uniform local_758;
  LayoutSpecifierBase local_580;
  DefOccurence local_570;
  DefOccurence local_56c;
  LayoutSpecifierBase local_568;
  DefOccurence local_554;
  LayoutSpecifierBase local_550;
  UniformType local_540;
  Uniform local_4b0;
  LayoutSpecifierBase local_2d8;
  DefOccurence local_2c8;
  DefOccurence local_2c4;
  LayoutSpecifierBase local_2c0;
  DefOccurence local_2ac;
  LayoutSpecifierBase local_2a8;
  UniformType local_290;
  Uniform local_200;
  undefined1 local_28 [8];
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  uniforms;
  UniformLocImplicitInSomeStages3 *this_local;
  
  uniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::vector((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
            *)local_28);
  UniformType::UniformType(&local_290,0x1406,0);
  DefOccurence::DefOccurence(&local_2ac,FSH_OR_CSH);
  local_2c0 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(3,local_2ac);
  local_2a8 = local_2c0;
  DefOccurence::DefOccurence(&local_2c4,ALL_SH);
  DefOccurence::DefOccurence(&local_2c8,ALL_BUT_FSH);
  local_2d8 = local_2a8;
  anon_unknown_0::Uniform::Uniform
            (&local_200,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_290,(Loc)local_2a8,local_2c4,local_2c8);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_28,&local_200);
  anon_unknown_0::Uniform::~Uniform(&local_200);
  UniformType::~UniformType(&local_290);
  UniformType::UniformType(&local_540,0x1406,0);
  DefOccurence::DefOccurence(&local_554,ALL_BUT_FSH);
  local_568 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(2,local_554);
  local_550 = local_568;
  DefOccurence::DefOccurence(&local_56c,ALL_SH);
  DefOccurence::DefOccurence(&local_570,FSH_OR_CSH);
  local_580 = local_550;
  anon_unknown_0::Uniform::Uniform
            (&local_4b0,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_540,(Loc)local_550,local_56c,local_570);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_28,&local_4b0);
  anon_unknown_0::Uniform::~Uniform(&local_4b0);
  UniformType::~UniformType(&local_540);
  UniformType::UniformType(&local_7e8,0x1406,3);
  DefOccurence::DefOccurence(&local_7fc,FSH_OR_CSH);
  local_810 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(7,local_7fc);
  local_7f8 = local_810;
  DefOccurence::DefOccurence(&local_814,ALL_SH);
  DefOccurence::DefOccurence(&local_818,ALL_BUT_FSH);
  local_828 = local_7f8;
  anon_unknown_0::Uniform::Uniform
            (&local_758,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_7e8,(Loc)local_7f8,local_814,local_818);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_28,&local_758);
  anon_unknown_0::Uniform::~Uniform(&local_758);
  UniformType::~UniformType(&local_7e8);
  UniformType::UniformType(&local_a90,0x1406,3);
  DefOccurence::DefOccurence(&local_aa4,ALL_BUT_FSH);
  local_ab8 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(4,local_aa4);
  local_aa0 = local_ab8;
  DefOccurence::DefOccurence(&local_abc,ALL_SH);
  DefOccurence::DefOccurence(&local_ac0,FSH_OR_CSH);
  local_ad0 = local_aa0;
  anon_unknown_0::Uniform::Uniform
            (&local_a00,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_a90,(Loc)local_aa0,local_abc,local_ac0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_28,&local_a00);
  anon_unknown_0::Uniform::~Uniform(&local_a00);
  UniformType::~UniformType(&local_a90);
  UniformType::UniformType(&local_d38,0x1406,0);
  DefOccurence::DefOccurence(&local_d4c,VSH);
  local_d60 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(0,local_d4c);
  local_d48 = local_d60;
  DefOccurence::DefOccurence(&local_d64,ALL_SH);
  DefOccurence::DefOccurence(&local_d68,ALL_BUT_VSH);
  local_d78 = local_d48;
  anon_unknown_0::Uniform::Uniform
            (&local_ca8,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_d38,(Loc)local_d48,local_d64,local_d68);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_28,&local_ca8);
  anon_unknown_0::Uniform::~Uniform(&local_ca8);
  UniformType::~UniformType(&local_d38);
  UniformType::UniformType(&local_fe0,0x1406,0);
  DefOccurence::DefOccurence(&local_ff4,ALL_BUT_FSH);
  local_1008 = (LayoutSpecifierBase)
               LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(1,local_ff4);
  local_ff0 = local_1008;
  DefOccurence::DefOccurence(&local_100c,ALL_SH);
  DefOccurence::DefOccurence(&local_1010,ALL_BUT_VSH);
  anon_unknown_0::Uniform::Uniform
            (&local_f50,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_fe0,(Loc)local_ff0,local_100c,local_1010);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_28,&local_f50);
  anon_unknown_0::Uniform::~Uniform(&local_f50);
  UniformType::~UniformType(&local_fe0);
  lVar1 = ExplicitUniformLocationCaseBase::doRun
                    (&this->super_ExplicitUniformLocationCaseBase,
                     (vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                      *)local_28);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::~vector((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
             *)local_28);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		std::vector<Uniform> uniforms;

		//location only in fsh, declaration in all shaders, usage in all shaders but fsh.
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT, Loc::C(3, DefOccurence::FSH_OR_CSH),
								   DefOccurence::ALL_SH, DefOccurence::ALL_BUT_FSH));

		//location in all but fsh, declaration in all shaders, usage in fsh.
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT, Loc::C(2, DefOccurence::ALL_BUT_FSH),
								   DefOccurence::ALL_SH, DefOccurence::FSH_OR_CSH));

		//location only in fsh, declaration in all shaders, usage in all shaders but fsh.
		uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_FLOAT, 3), Loc::C(7, DefOccurence::FSH_OR_CSH),
								   DefOccurence::ALL_SH, DefOccurence::ALL_BUT_FSH));

		//location in all but fsh, declaration in all shaders, usage in fsh.
		uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_FLOAT, 3),
								   Loc::C(4, DefOccurence::ALL_BUT_FSH), DefOccurence::ALL_SH,
								   DefOccurence::FSH_OR_CSH));

		//location only in vsh, declaration in all shaders, usage in all shaders but vsh.
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT, Loc::C(0, DefOccurence::VSH), DefOccurence::ALL_SH,
								   DefOccurence::ALL_BUT_VSH));

		//location only in vsh, declaration in all shaders, usage in all shaders but vsh.
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT, Loc::C(1, DefOccurence::ALL_BUT_FSH),
								   DefOccurence::ALL_SH, DefOccurence::ALL_BUT_VSH));

		return doRun(uniforms);
	}